

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O1

void vepu54x_h265_set_hw_address(H265eV541HalContext *ctx,H265eV541RegSet *regs,HalEncTask *task)

{
  MppBufferGroup *group;
  void *pvVar1;
  MppBuffer buffer;
  MppDev dev;
  RK_U32 RVar2;
  HalBuf *pHVar3;
  HalBuf *pHVar4;
  size_t sVar5;
  
  pvVar1 = (task->syntax).data;
  buffer = task->md_info;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","(%d) enter\n",(char *)0x0,0x56d);
  }
  RVar2 = mpp_buffer_get_fd_with_caller(task->input,"vepu54x_h265_set_hw_address");
  regs->adr_srcy_hevc = RVar2;
  regs->adr_srcu_hevc = RVar2;
  regs->adr_srcv_hevc = RVar2;
  pHVar3 = hal_bufs_get_buf(ctx->dpb_bufs,(uint)*(byte *)((long)pvVar1 + 0xe8));
  pHVar4 = hal_bufs_get_buf(ctx->dpb_bufs,(uint)*(byte *)((long)pvVar1 + 0xe9));
  if (*(int *)((long)pvVar1 + 0x120) == 0) {
    RVar2 = mpp_buffer_get_fd_with_caller(*pHVar3->buf,"vepu54x_h265_set_hw_address");
    regs->rfpw_h_addr_hevc = RVar2;
    regs->rfpw_b_addr_hevc = RVar2;
    mpp_dev_set_reg_offset(ctx->dev,0x4b,ctx->fbc_header_len);
  }
  RVar2 = mpp_buffer_get_fd_with_caller(pHVar3->buf[1],"vepu54x_h265_set_hw_address");
  regs->dspw_addr_hevc = RVar2;
  RVar2 = mpp_buffer_get_fd_with_caller(pHVar3->buf[2],"vepu54x_h265_set_hw_address");
  regs->cmvw_addr_hevc = RVar2;
  RVar2 = mpp_buffer_get_fd_with_caller(*pHVar4->buf,"vepu54x_h265_set_hw_address");
  regs->rfpr_h_addr_hevc = RVar2;
  regs->rfpr_b_addr_hevc = RVar2;
  RVar2 = mpp_buffer_get_fd_with_caller(pHVar4->buf[1],"vepu54x_h265_set_hw_address");
  regs->dspr_addr_hevc = RVar2;
  RVar2 = mpp_buffer_get_fd_with_caller(pHVar4->buf[2],"vepu54x_h265_set_hw_address");
  regs->cmvr_addr_hevc = RVar2;
  mpp_dev_set_reg_offset(ctx->dev,0x4d,ctx->fbc_header_len);
  if ((*(byte *)((long)pvVar1 + 0x28) & 0x80) != 0) {
    group = &ctx->tile_grp;
    if (ctx->tile_grp == (MppBufferGroup)0x0) {
      mpp_buffer_group_get
                (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v541",
                 "vepu54x_h265_set_hw_address");
    }
    if (*group == (MppBufferGroup)0x0) {
      _mpp_log_l(2,"hal_h265e_v541","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->tile_grp",
                 "vepu54x_h265_set_hw_address",0x589);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    if (ctx->hw_tile_buf[0] == (MppBuffer)0x0) {
      mpp_buffer_get_with_tag
                (*group,ctx->hw_tile_buf,0x20000,"hal_h265e_v541","vepu54x_h265_set_hw_address");
    }
    if (ctx->hw_tile_buf[1] == (MppBuffer)0x0) {
      mpp_buffer_get_with_tag
                (*group,ctx->hw_tile_buf + 1,0x20000,"hal_h265e_v541","vepu54x_h265_set_hw_address")
      ;
    }
    RVar2 = mpp_buffer_get_fd_with_caller(ctx->hw_tile_buf[0],"vepu54x_h265_set_hw_address");
    regs->lpfw_addr_hevc = RVar2;
    RVar2 = mpp_buffer_get_fd_with_caller(ctx->hw_tile_buf[1],"vepu54x_h265_set_hw_address");
    regs->lpfr_addr_hevc = RVar2;
  }
  if (buffer == (MppBuffer)0x0) {
    regs->enc_pic = (anon_struct_4_17_53488935_for_enc_pic)((uint)regs->enc_pic & 0xfffffff7);
    RVar2 = 0;
  }
  else {
    regs->enc_pic = (anon_struct_4_17_53488935_for_enc_pic)((uint)regs->enc_pic | 8);
    RVar2 = mpp_buffer_get_fd_with_caller(buffer,"vepu54x_h265_set_hw_address");
  }
  regs->meiw_addr_hevc = RVar2;
  RVar2 = mpp_buffer_get_fd_with_caller(task->output,"vepu54x_h265_set_hw_address");
  regs->bsbb_addr_hevc = RVar2;
  regs->bsbt_addr_hevc = RVar2;
  regs->bsbr_addr_hevc = RVar2;
  regs->bsbw_addr_hevc = RVar2;
  dev = ctx->dev;
  sVar5 = mpp_packet_get_length(task->packet);
  mpp_dev_set_reg_offset(dev,0x56,(RK_U32)sVar5);
  RVar2 = mpp_frame_get_offset_y(task->frame);
  regs->pic_ofst =
       (anon_struct_4_4_a6b85103_for_pic_ofst)((uint)regs->pic_ofst & 0xffffe000 | RVar2 & 0x1fff);
  RVar2 = mpp_frame_get_offset_x(task->frame);
  regs->pic_ofst =
       (anon_struct_4_4_a6b85103_for_pic_ofst)
       ((uint)regs->pic_ofst & 0xe000ffff | (RVar2 & 0x1fff) << 0x10);
  return;
}

Assistant:

void vepu54x_h265_set_hw_address(H265eV541HalContext *ctx, H265eV541RegSet *regs, HalEncTask *task)
{
    HalEncTask *enc_task = task;
    HalBuf *recon_buf, *ref_buf;
    MppBuffer md_info_buf = enc_task->md_info;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;

    hal_h265e_enter();

    regs->adr_srcy_hevc     = mpp_buffer_get_fd(enc_task->input);
    regs->adr_srcu_hevc     = regs->adr_srcy_hevc;
    regs->adr_srcv_hevc     = regs->adr_srcy_hevc;

    recon_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.recon_pic.slot_idx);
    ref_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.ref_pic.slot_idx);
    if (!syn->sp.non_reference_flag) {
        regs->rfpw_h_addr_hevc  = mpp_buffer_get_fd(recon_buf->buf[0]);
        regs->rfpw_b_addr_hevc  = regs->rfpw_h_addr_hevc;

        mpp_dev_set_reg_offset(ctx->dev, 75, ctx->fbc_header_len);
    }

    regs->dspw_addr_hevc = mpp_buffer_get_fd(recon_buf->buf[1]);
    regs->cmvw_addr_hevc  = mpp_buffer_get_fd(recon_buf->buf[2]);
    regs->rfpr_h_addr_hevc = mpp_buffer_get_fd(ref_buf->buf[0]);
    regs->rfpr_b_addr_hevc = regs->rfpr_h_addr_hevc;
    regs->dspr_addr_hevc = mpp_buffer_get_fd(ref_buf->buf[1]);
    regs->cmvr_addr_hevc = mpp_buffer_get_fd(ref_buf->buf[2]);

    mpp_dev_set_reg_offset(ctx->dev, 77, ctx->fbc_header_len);

    if (syn->pp.tiles_enabled_flag) {
        if (NULL == ctx->tile_grp)
            mpp_buffer_group_get_internal(&ctx->tile_grp, MPP_BUFFER_TYPE_ION);

        mpp_assert(ctx->tile_grp);

        if (NULL == ctx->hw_tile_buf[0]) {
            mpp_buffer_get(ctx->tile_grp, &ctx->hw_tile_buf[0], TILE_BUF_SIZE);
        }

        if (NULL == ctx->hw_tile_buf[1]) {
            mpp_buffer_get(ctx->tile_grp, &ctx->hw_tile_buf[1], TILE_BUF_SIZE);
        }

        regs->lpfw_addr_hevc  = mpp_buffer_get_fd(ctx->hw_tile_buf[0]);
        regs->lpfr_addr_hevc = mpp_buffer_get_fd(ctx->hw_tile_buf[1]);
    }

    if (md_info_buf) {
        regs->enc_pic.mei_stor    = 1;
        regs->meiw_addr_hevc = mpp_buffer_get_fd(md_info_buf);
    } else {
        regs->enc_pic.mei_stor    = 0;
        regs->meiw_addr_hevc = 0;
    }

    regs->bsbb_addr_hevc    = mpp_buffer_get_fd(enc_task->output);
    /* TODO: stream size relative with syntax */
    regs->bsbt_addr_hevc    = regs->bsbb_addr_hevc;
    regs->bsbr_addr_hevc    = regs->bsbb_addr_hevc;
    regs->bsbw_addr_hevc    = regs->bsbb_addr_hevc;

    mpp_dev_set_reg_offset(ctx->dev, 86, mpp_packet_get_length(task->packet));

    regs->pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);
}